

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  logger app_logs;
  path local_c8;
  logger local_a0;
  
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_c8,(char (*) [7])"./logs",auto_format);
  logger::logger(&local_a0,&local_c8);
  std::filesystem::__cxx11::path::~path(&local_c8);
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((signals *)&local_c8,(char (*) [13])"warnings.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((signals *)&local_c8,(char (*) [11])"errors.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 3;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 1;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[24]>
            ((signals *)&local_c8,(char (*) [24])"application has started");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((signals *)&local_c8,(char (*) [13])"warnings.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((signals *)&local_c8,(char (*) [11])"errors.log");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter a newline to execute pending operations:\n",0x2f);
  std::istream::get();
  handlebars::
  dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::respond(0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_selected_file._M_dataplus._M_p != &local_a0.m_selected_file.field_2) {
    operator_delete(local_a0.m_selected_file._M_dataplus._M_p,
                    local_a0.m_selected_file.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0.m_open_files._M_h);
  std::filesystem::__cxx11::path::~path(&local_a0.m_log_directory);
  handlebars::
  handles<logger,_signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~handles(&local_a0.
              super_handles<logger,_signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            );
  return 0;
}

Assistant:

int
main()
{
  logger app_logs("./logs");
  app_logs.push_event(signals::open, "info.log");
  app_logs.push_event(signals::open, "warnings.log");
  app_logs.push_event(signals::open, "errors.log");
  app_logs.push_event(signals::select, "info.log");
  app_logs.push_event(signals::write, "application has started");
  app_logs.push_event(signals::close, "info.log");
  app_logs.push_event(signals::close, "warnings.log");
  app_logs.push_event(signals::close, "errors.log");

  std::cout << "Enter a newline to execute pending operations:\n";
  std::cin.get();

  app_logs.respond();
  return 0;
}